

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_array_ref.hpp
# Opt level: O1

void __thiscall
boost::
const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
::init_multi_array_ref<long*>
          (const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
           *this,long *extents_iter)

{
  byte bVar1;
  long lVar2;
  index iVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  
  lVar2 = 0;
  do {
    *(long *)(this + lVar2 * 8 + 0x20) = extents_iter[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 2);
  auVar6._8_8_ = *(undefined8 *)(this + 0x28);
  auVar6._0_8_ = *(undefined8 *)(this + 0x28);
  auVar6 = vpmullq_avx512vl(*(undefined1 (*) [16])(this + 0x20),auVar6);
  *(long *)(this + 0x60) = auVar6._0_8_;
  lVar2 = 1;
  lVar4 = 1;
  do {
    lVar5 = -lVar4;
    if (this[*(long *)(this + lVar2 * 8) + 0x18] !=
        (const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
         )0x0) {
      lVar5 = lVar4;
    }
    *(long *)(this + *(long *)(this + lVar2 * 8) * 8 + 0x30) = lVar5;
    lVar4 = lVar4 * *(long *)(this + *(long *)(this + lVar2 * 8) * 8 + 0x20);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  iVar3 = detail::multi_array::
          multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
          ::
          calculate_origin_offset<boost::array<long,2ul>,boost::array<unsigned_long,2ul>,boost::array<long,2ul>>
                    ((multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul>
                      *)this,(array<long,_2UL> *)(this + 0x30),
                     (array<unsigned_long,_2UL> *)(this + 0x20),
                     (general_storage_order<2UL> *)(this + 8),(array<long,_2UL> *)(this + 0x40));
  *(index *)(this + 0x50) = iVar3;
  bVar1 = 1;
  lVar2 = 0;
  do {
    bVar1 = bVar1 & (byte)this[lVar2 + 0x18];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 2);
  if (bVar1 == 0) {
    lVar4 = -2;
    lVar2 = 0;
    do {
      if (this[lVar4 + 0x1a] ==
          (const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
           )0x0) {
        lVar2 = lVar2 - (*(long *)(this + 0x30 + lVar4 * 8) + -1) *
                        *(long *)(this + lVar4 * 8 + 0x40);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0);
  }
  else {
    lVar2 = 0;
  }
  *(long *)(this + 0x58) = lVar2;
  return;
}

Assistant:

void init_multi_array_ref(InputIterator extents_iter) {
    boost::function_requires<InputIteratorConcept<InputIterator> >();

    boost::detail::multi_array::
      copy_n(extents_iter,num_dimensions(),extent_list_.begin());

    // Calculate the array size
    num_elements_ = std::accumulate(extent_list_.begin(),extent_list_.end(),
                            size_type(1),std::multiplies<size_type>());

    this->compute_strides(stride_list_,extent_list_,storage_);

    origin_offset_ =
      this->calculate_origin_offset(stride_list_,extent_list_,
                              storage_,index_base_list_);
    directional_offset_ =
      this->calculate_descending_dimension_offset(stride_list_,extent_list_,
                                            storage_);
  }